

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

int hessian_opt(custom_function *funcpt,custom_gradient *funcgrad,double *x,int N,double *jac,
               double *dx,double eps,double eps2,double *H)

{
  undefined4 local_4c;
  int retval;
  double eps2_local;
  double eps_local;
  double *dx_local;
  double *jac_local;
  int N_local;
  double *x_local;
  custom_gradient *funcgrad_local;
  custom_function *funcpt_local;
  
  local_4c = 0;
  if (funcgrad == (custom_gradient *)0x0) {
    local_4c = hessian_fd(funcpt,x,N,dx,eps,H);
  }
  else {
    hessian_fdg(funcgrad,x,N,jac,dx,eps2,H);
  }
  return local_4c;
}

Assistant:

int hessian_opt(custom_function *funcpt, custom_gradient *funcgrad, double *x, int N, double *jac,
		double *dx,double eps,double eps2,double *H) {
	int retval;
	retval = 0;
	if (funcgrad == NULL) {
		//printf("HESSF \n");
		retval = hessian_fd(funcpt,x,N,dx,eps,H);
	} else {
		//printf("HESSG \n");
		hessian_fdg(funcgrad,x,N,jac,dx,eps2,H);
	}

	return retval;
}